

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O2

void glu::initCoreFunctions(Functions *dst,FunctionLoader *loader,ApiType apiType)

{
  long lVar1;
  int iVar2;
  InternalError *this;
  long lVar3;
  allocator<char> local_7d;
  ApiType apiType_local;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  apiType_local.m_bits = apiType.m_bits;
  if (initCoreFunctions(glw::Functions*,glw::FunctionLoader_const*,glu::ApiType)::s_initFuncs ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&initCoreFunctions(glw::Functions*,glw::FunctionLoader_const*,glu::ApiType)
                                 ::s_initFuncs);
    if (iVar2 != 0) {
      initCoreFunctions::s_initFuncs[0].apiType.m_bits = 2;
      initCoreFunctions::s_initFuncs[0].initFunc = glw::initES20;
      initCoreFunctions::s_initFuncs[1].apiType.m_bits = 3;
      initCoreFunctions::s_initFuncs[1].initFunc = glw::initES30;
      initCoreFunctions::s_initFuncs[2].apiType.m_bits = 0x13;
      initCoreFunctions::s_initFuncs[2].initFunc = glw::initES31;
      initCoreFunctions::s_initFuncs[3].apiType.m_bits = 0x23;
      initCoreFunctions::s_initFuncs[3].initFunc = glw::initES32;
      initCoreFunctions::s_initFuncs[4].apiType.m_bits = 0x103;
      initCoreFunctions::s_initFuncs[4].initFunc = glw::initGL30Core;
      initCoreFunctions::s_initFuncs[5].apiType.m_bits = 0x113;
      initCoreFunctions::s_initFuncs[5].initFunc = glw::initGL31Core;
      initCoreFunctions::s_initFuncs[6].apiType.m_bits = 0x123;
      initCoreFunctions::s_initFuncs[6].initFunc = glw::initGL32Core;
      initCoreFunctions::s_initFuncs[7].apiType.m_bits = 0x133;
      initCoreFunctions::s_initFuncs[7].initFunc = glw::initGL33Core;
      initCoreFunctions::s_initFuncs[8].apiType.m_bits = 0x104;
      initCoreFunctions::s_initFuncs[8].initFunc = glw::initGL40Core;
      initCoreFunctions::s_initFuncs[9].apiType.m_bits = 0x114;
      initCoreFunctions::s_initFuncs[9].initFunc = glw::initGL41Core;
      initCoreFunctions::s_initFuncs[10].apiType.m_bits = 0x124;
      initCoreFunctions::s_initFuncs[10].initFunc = glw::initGL42Core;
      initCoreFunctions::s_initFuncs[0xb].apiType.m_bits = 0x134;
      initCoreFunctions::s_initFuncs[0xb].initFunc = glw::initGL43Core;
      initCoreFunctions::s_initFuncs[0xc].apiType.m_bits = 0x144;
      initCoreFunctions::s_initFuncs[0xc].initFunc = glw::initGL44Core;
      initCoreFunctions::s_initFuncs[0xd].apiType.m_bits = 0x154;
      initCoreFunctions::s_initFuncs[0xd].initFunc = glw::initGL45Core;
      __cxa_guard_release(&initCoreFunctions(glw::Functions*,glw::FunctionLoader_const*,glu::ApiType)
                           ::s_initFuncs);
    }
  }
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x10 == 0xf0) {
      this = (InternalError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Don\'t know how to load functions for ",&local_7d);
      de::toString<glu::ApiType>(&local_78,&apiType_local);
      std::operator+(&local_38,&local_58,&local_78);
      tcu::InternalError::InternalError(this,&local_38);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
    lVar1 = lVar3 + 0x10;
  } while (*(deUint32 *)((long)&initCoreFunctions::s_initFuncs[0].apiType.m_bits + lVar3) !=
           apiType_local.m_bits);
  (**(code **)((long)&initCoreFunctions::s_initFuncs[0].initFunc + lVar3))(dst,loader);
  return;
}

Assistant:

void initCoreFunctions (glw::Functions* dst, const glw::FunctionLoader* loader, ApiType apiType)
{
	static const struct
	{
		ApiType		apiType;
		void		(*initFunc)		(glw::Functions* gl, const glw::FunctionLoader* loader);
	} s_initFuncs[] =
	{
		{ ApiType::es(2,0),		glw::initES20		},
		{ ApiType::es(3,0),		glw::initES30		},
		{ ApiType::es(3,1),		glw::initES31		},
		{ ApiType::es(3,2),		glw::initES32		},
		{ ApiType::core(3,0),	glw::initGL30Core	},
		{ ApiType::core(3,1),	glw::initGL31Core	},
		{ ApiType::core(3,2),	glw::initGL32Core	},
		{ ApiType::core(3,3),	glw::initGL33Core	},
		{ ApiType::core(4,0),	glw::initGL40Core	},
		{ ApiType::core(4,1),	glw::initGL41Core	},
		{ ApiType::core(4,2),	glw::initGL42Core	},
		{ ApiType::core(4,3),	glw::initGL43Core	},
		{ ApiType::core(4,4),	glw::initGL44Core	},
		{ ApiType::core(4,5),	glw::initGL45Core	},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_initFuncs); ndx++)
	{
		if (s_initFuncs[ndx].apiType == apiType)
		{
			s_initFuncs[ndx].initFunc(dst, loader);
			return;
		}
	}

	throw tcu::InternalError(std::string("Don't know how to load functions for ") + de::toString(apiType));
}